

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O2

void __thiscall UDPServer::on_output(UDPServer *this,Poll *p)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
  *ppVar1;
  size_type sVar2;
  ostream *poVar3;
  string local_70 [32];
  value_type msg;
  
  ppVar1 = (this->msg_queue).c.
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->msg_queue).c.
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
    ::pair(&msg,ppVar1);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
    ::pop_front(&(this->msg_queue).c);
    sVar2 = sendto((this->super_Subscriber).fd,msg.first._M_dataplus._M_p,msg.first._M_string_length
                   ,0,(sockaddr *)&msg.second,0x10);
    if (msg.first._M_string_length != sVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"UDPServer: error in writing to udp socket ");
      from_errno_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,local_70);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_70);
    }
    if ((this->msg_queue).c.
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->msg_queue).c.
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      Subscriber::set_expected(&this->super_Subscriber,1);
      Poll::notify_subscriber_changed(p,&this->super_Subscriber);
    }
    std::__cxx11::string::~string((string *)&msg);
    return;
  }
  Subscriber::set_expected(&this->super_Subscriber,1);
  Poll::notify_subscriber_changed(p,&this->super_Subscriber);
  return;
}

Assistant:

void UDPServer::on_output(Poll &p) {
  if (msg_queue.empty()) {
    set_expected(POLLIN);
    p.notify_subscriber_changed(*this);
    return;
  }
  auto msg = msg_queue.front();
  msg_queue.pop();
  socklen_t len = sizeof(msg.second);
  if (msg.first.size() != sendto(fd, &msg.first[0], msg.first.size(), 0, (struct sockaddr *) &msg.second, len)) {
    std::cout << "UDPServer: error in writing to udp socket " << from_errno() << std::endl;
  }
  if (msg_queue.empty()) {
    set_expected(POLLIN);
    p.notify_subscriber_changed(*this);
  }
}